

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

Future<std::error_code> * __thiscall cinatra::coro_http_server::async_start(coro_http_server *this)

{
  bool bVar1;
  socklen_t *__addr_len;
  int in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar3;
  coro_http_server *in_RSI;
  Future<std::error_code> *in_RDI;
  Promise<std::error_code> promise;
  Future<std::error_code> *future;
  error_code *in_stack_ffffffffffffff48;
  type *in_stack_ffffffffffffff78;
  thread *in_stack_ffffffffffffff80;
  FutureState<std::error_code> *in_stack_ffffffffffffff88;
  Promise<std::error_code> *in_stack_ffffffffffffff90;
  _Head_base<0UL,_coro_io::io_context_pool_*,_false> in_stack_ffffffffffffffa0;
  uint local_20;
  undefined4 uStack_1c;
  
  local_20 = listen(in_RSI,(int)in_RSI,in_EDX);
  __addr_len = (socklen_t *)(ulong)local_20;
  *(ulong *)&in_RSI->errc_ = CONCAT44(uStack_1c,local_20);
  (in_RSI->errc_)._M_cat = (error_category *)CONCAT44(extraout_var,extraout_EDX);
  async_simple::Promise<std::error_code>::Promise(in_stack_ffffffffffffff90);
  async_simple::Promise<std::error_code>::getFuture((Promise<std::error_code> *)in_RSI);
  bVar1 = std::error_code::operator_cast_to_bool(&in_RSI->errc_);
  if (bVar1) {
    async_simple::Try<std::error_code>::Try<std::error_code_&>
              ((Try<std::error_code> *)in_RDI,in_stack_ffffffffffffff48);
    async_simple::Promise<std::error_code>::setValue
              ((Promise<std::error_code> *)in_RDI,(Try<std::error_code> *)in_stack_ffffffffffffff48)
    ;
    async_simple::Try<std::error_code>::~Try((Try<std::error_code> *)0x33a06b);
  }
  else {
    uVar2 = extraout_EDX_00;
    uVar3 = extraout_var_00;
    if (in_RSI->out_ctx_ == (io_context *)0x0) {
      std::thread::thread<cinatra::coro_http_server::async_start()::_lambda()_1_,,void>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::thread::operator=((thread *)in_RDI,(thread *)in_stack_ffffffffffffff48);
      std::thread::~thread((thread *)0x339f80);
      uVar2 = extraout_EDX_01;
      uVar3 = extraout_var_01;
    }
    accept((coro_http_server *)&stack0xffffffffffffffa0,(int)in_RSI,
           (sockaddr *)CONCAT44(uVar3,uVar2),__addr_len);
    async_simple::Promise<std::error_code>::Promise
              ((Promise<std::error_code> *)&stack0xffffffffffffff88,
               (Promise<std::error_code> *)&stack0xffffffffffffffd0);
    async_simple::coro::detail::LazyBase<std::error_code,_false>::
    start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_coro_http_server_hpp:96:22)>
              ((LazyBase<std::error_code,_false> *)in_stack_ffffffffffffff90,
               (type *)in_stack_ffffffffffffff88);
    async_start()::{lambda(auto:1&&)#1}::~async_start((type *)0x339ff2);
    async_simple::coro::Lazy<std::error_code>::~Lazy((Lazy<std::error_code> *)0x339ffc);
  }
  async_simple::Promise<std::error_code>::~Promise
            ((Promise<std::error_code> *)in_stack_ffffffffffffffa0._M_head_impl);
  return in_RDI;
}

Assistant:

async_simple::Future<std::error_code> async_start() {
    errc_ = listen();

    async_simple::Promise<std::error_code> promise;
    auto future = promise.getFuture();

    if (!errc_) {
      if (out_ctx_ == nullptr) {
        thd_ = std::thread([this] {
          pool_->run();
        });
      }

      accept().start([p = std::move(promise), this](auto &&res) mutable {
        if (res.hasError()) {
          errc_ = std::make_error_code(std::errc::io_error);
          p.setValue(errc_);
        }
        else {
          p.setValue(res.value());
        }
      });
    }
    else {
      promise.setValue(errc_);
    }

    return future;
  }